

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool parseOptions(Settings *settings,int argc,char **argv)

{
  bool bVar1;
  char *pcVar2;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar3;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar4;
  options_description *poVar5;
  basic_command_line_parser<char> *pbVar6;
  ostream *poVar7;
  void *this;
  error *peVar8;
  ulong uVar9;
  allocator<char> local_439;
  string local_438;
  undefined1 local_412;
  allocator<char> local_411;
  string local_410;
  undefined1 local_3ea;
  allocator<char> local_3e9;
  string local_3e8;
  undefined1 local_3c2;
  allocator<char> local_3c1;
  string local_3c0;
  undefined1 local_39a;
  allocator<char> local_399;
  string local_398;
  undefined4 local_374;
  anon_class_8_1_8992f624 local_370;
  anon_class_8_1_8992f624 isSpecified;
  basic_parsed_options<char> local_2f0;
  variables_map local_2c8 [8];
  variables_map vmap;
  options_description local_228 [8];
  options_description oDesc;
  positional_options_description local_1a8 [8];
  positional_options_description poDesc;
  undefined8 local_170;
  options_description local_168 [8];
  options_description oHidden;
  undefined8 local_e8 [3];
  allocator<char> local_c9;
  string local_c8 [32];
  options_description local_a8 [8];
  options_description oVisible;
  char **argv_local;
  int argc_local;
  Settings *settings_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"Generic options",&local_c9);
  boost::program_options::options_description::options_description
            (local_a8,local_c8,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  local_e8[0] = boost::program_options::options_description::add_options();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_e8,"help,h");
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,"objdump,O");
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,"extract,X");
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,"strip,S");
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,"list,l");
  ptVar3 = boost::program_options::
           value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     (&settings->highlightNameList);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"highlight,t",(char *)ptVar3);
  ptVar4 = boost::program_options::value<std::__cxx11::string>(&settings->stmName);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"stm,s",(char *)ptVar4);
  ptVar4 = boost::program_options::value<std::__cxx11::string>(&settings->generatorName);
  boost::program_options::options_description_easy_init::operator()
            (pcVar2,(value_semantic *)"generator,g",(char *)ptVar4);
  boost::program_options::options_description::options_description
            (local_168,(uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  local_170 = boost::program_options::options_description::add_options();
  ptVar3 = boost::program_options::
           value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     (&settings->inputFiles);
  ptVar3 = boost::program_options::
           typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
           ::multitoken(ptVar3);
  boost::program_options::options_description_easy_init::operator()
            ((char *)&local_170,(value_semantic *)"input",(char *)ptVar3);
  boost::program_options::positional_options_description::positional_options_description(local_1a8);
  boost::program_options::positional_options_description::add((char *)local_1a8,0x149472);
  boost::program_options::options_description::options_description
            (local_228,(uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  poVar5 = (options_description *)boost::program_options::options_description::add(local_228);
  boost::program_options::options_description::add(poVar5);
  boost::program_options::variables_map::variables_map(local_2c8);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)&isSpecified,argc,argv);
  pbVar6 = boost::program_options::basic_command_line_parser<char>::options
                     ((basic_command_line_parser<char> *)&isSpecified,local_228);
  pbVar6 = boost::program_options::basic_command_line_parser<char>::positional(pbVar6,local_1a8);
  boost::program_options::basic_command_line_parser<char>::run(&local_2f0,pbVar6);
  boost::program_options::store((basic_parsed_options *)&local_2f0,local_2c8,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_2f0);
  boost::program_options::basic_command_line_parser<char>::~basic_command_line_parser
            ((basic_command_line_parser<char> *)&isSpecified);
  boost::program_options::notify(local_2c8);
  local_370.vmap = local_2c8;
  bVar1 = parseOptions::anon_class_8_1_8992f624::operator()(&local_370,"help");
  if (bVar1) {
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "bosce: BOost State Chart Extractor (from objdump)\n\nUsage:\n  bosce <input files> [options]\n\n"
                            );
    this = (void *)boost::program_options::operator<<(poVar7,local_a8);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    settings_local._7_1_ = false;
  }
  else {
    bVar1 = parseOptions::anon_class_8_1_8992f624::operator()(&local_370,"input");
    if (!bVar1) {
      local_39a = 1;
      peVar8 = (error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_398,"input file is not specified",&local_399);
      boost::program_options::error::error(peVar8,&local_398);
      local_39a = 0;
      __cxa_throw(peVar8,&boost::program_options::error::typeinfo,
                  boost::program_options::error::~error);
    }
    bVar1 = parseOptions::anon_class_8_1_8992f624::operator()(&local_370,"objdump");
    settings->isUseObjdump = bVar1;
    bVar1 = parseOptions::anon_class_8_1_8992f624::operator()(&local_370,"extract");
    settings->isExtractObjdump = bVar1;
    bVar1 = parseOptions::anon_class_8_1_8992f624::operator()(&local_370,"strip");
    settings->isStripObjdump = bVar1;
    bVar1 = parseOptions::anon_class_8_1_8992f624::operator()(&local_370,"list");
    settings->isListStms = bVar1;
    if ((settings->isExtractObjdump & 1U) == 0) {
      if ((settings->isStripObjdump & 1U) == 0) {
        if ((settings->isListStms & 1U) == 0) {
          uVar9 = std::__cxx11::string::empty();
          if ((uVar9 & 1) != 0) {
            std::__cxx11::string::operator=((string *)&settings->generatorName,"plantuml");
          }
        }
        else {
          uVar9 = std::__cxx11::string::empty();
          if (((uVar9 & 1) == 0) || (uVar9 = std::__cxx11::string::empty(), (uVar9 & 1) == 0)) {
            peVar8 = (error *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_438,
                       "option \'-l\' cannot be combined with options \'-s\' and \'-g\'",&local_439)
            ;
            boost::program_options::error::error(peVar8,&local_438);
            __cxa_throw(peVar8,&boost::program_options::error::typeinfo,
                        boost::program_options::error::~error);
          }
          std::__cxx11::string::operator=((string *)&settings->generatorName,"stmlist");
        }
      }
      else {
        if (((settings->isUseObjdump & 1U) == 0) && ((settings->isExtractObjdump & 1U) == 0)) {
          local_3ea = 1;
          peVar8 = (error *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3e8,
                     "option \'-S\' must be combined with either \'-X\' or \'-O\'",&local_3e9);
          boost::program_options::error::error(peVar8,&local_3e8);
          local_3ea = 0;
          __cxa_throw(peVar8,&boost::program_options::error::typeinfo,
                      boost::program_options::error::~error);
        }
        if ((((settings->isListStms & 1U) != 0) ||
            (uVar9 = std::__cxx11::string::empty(), (uVar9 & 1) == 0)) ||
           (uVar9 = std::__cxx11::string::empty(), (uVar9 & 1) == 0)) {
          local_412 = 1;
          peVar8 = (error *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_410,"option \'-S\' can be combined only with option \'-X\'",
                     &local_411);
          boost::program_options::error::error(peVar8,&local_410);
          local_412 = 0;
          __cxa_throw(peVar8,&boost::program_options::error::typeinfo,
                      boost::program_options::error::~error);
        }
      }
    }
    else if ((((settings->isUseObjdump & 1U) != 0) || ((settings->isListStms & 1U) != 0)) ||
            ((uVar9 = std::__cxx11::string::empty(), (uVar9 & 1) == 0 ||
             (uVar9 = std::__cxx11::string::empty(), (uVar9 & 1) == 0)))) {
      local_3c2 = 1;
      peVar8 = (error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3c0,"option \'-X\' can be combined only with option \'-S\'",
                 &local_3c1);
      boost::program_options::error::error(peVar8,&local_3c0);
      local_3c2 = 0;
      __cxa_throw(peVar8,&boost::program_options::error::typeinfo,
                  boost::program_options::error::~error);
    }
    settings_local._7_1_ = true;
  }
  local_374 = 1;
  boost::program_options::variables_map::~variables_map(local_2c8);
  boost::program_options::options_description::~options_description(local_228);
  boost::program_options::positional_options_description::~positional_options_description(local_1a8)
  ;
  boost::program_options::options_description::~options_description(local_168);
  boost::program_options::options_description::~options_description(local_a8);
  return settings_local._7_1_;
}

Assistant:

static bool parseOptions(Settings &settings, int argc, char *argv[])
{
    po::options_description oVisible("Generic options");
    // clang-format off
    oVisible.add_options()
            ("help,h", "Show this help message")
            ("objdump,O", "Input files is an objdump instead of binary")
            ("extract,X", "Only extract an objdump out of an input binary")
            ("strip,S", "Strip an objdump to contain only relevant data")
            ("list,l", "List all state-machine names")
            ("highlight,t", po::value<std::vector<std::string>>(&settings.highlightNameList),
             "Highlight given names in the generated state-machine output (multiple use possible)")
            ("stm,s", po::value<std::string>(&settings.stmName),
             "Generate an output for a specific state-machine")
            ("generator,g", po::value<std::string>(&settings.generatorName),
             "Specify a generator (plantuml, stmlist, text, yaml)");
    // clang-format on

    po::options_description oHidden;
    oHidden.add_options()("input",
                          po::value<std::vector<std::string>>(&settings.inputFiles)->multitoken(),
                          "Input files");

    po::positional_options_description poDesc;
    poDesc.add("input", -1);

    po::options_description oDesc;
    oDesc.add(oHidden).add(oVisible);

    po::variables_map vmap;
    po::store(po::command_line_parser(argc, argv).options(oDesc).positional(poDesc).run(), vmap);
    po::notify(vmap);

    auto isSpecified = [&vmap](const char *optName) { return vmap.count(optName) > 0; };

    if (isSpecified("help")) {
        std::cout << "bosce: BOost State Chart Extractor (from objdump)\n\n"
                     "Usage:\n  bosce <input files> [options]\n\n"
                  << oVisible << std::endl;
        return false;
    }

    if (!isSpecified("input")) {
        throw po::error("input file is not specified");
    }

    settings.isUseObjdump = isSpecified("objdump");
    settings.isExtractObjdump = isSpecified("extract");
    settings.isStripObjdump = isSpecified("strip");
    settings.isListStms = isSpecified("list");

    if (settings.isExtractObjdump) {
        if (settings.isUseObjdump || settings.isListStms || !settings.stmName.empty()
            || !settings.generatorName.empty()) {
            throw po::error("option '-X' can be combined only with option '-S'");
        }
    } else if (settings.isStripObjdump) {
        if (!(settings.isUseObjdump || settings.isExtractObjdump)) {
            throw po::error("option '-S' must be combined with either '-X' or '-O'");
        }
        if (settings.isListStms || !settings.stmName.empty() || !settings.generatorName.empty()) {
            throw po::error("option '-S' can be combined only with option '-X'");
        }
    } else if (settings.isListStms) {
        if (!settings.stmName.empty() || !settings.generatorName.empty()) {
            throw po::error("option '-l' cannot be combined with options '-s' and '-g'");
        }
        settings.generatorName = "stmlist";
    } else if (settings.generatorName.empty()) {
        // by default use plantuml as the most sophisticated generator:
        settings.generatorName = "plantuml";
    }

    return true;
}